

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

void __thiscall Logger::Impl::formatTime(Impl *this)

{
  tm *__tp;
  char acStack_58 [8];
  char str_t [26];
  timeval tv;
  time_t time;
  
  str_t[8] = '\0';
  str_t[9] = '\0';
  str_t[10] = '\0';
  str_t[0xb] = '\0';
  str_t[0xc] = '\0';
  str_t[0xd] = '\0';
  str_t[0xe] = '\0';
  str_t[0xf] = '\0';
  str_t[0x10] = '\0';
  str_t[0x11] = '\0';
  acStack_58[0] = '\0';
  acStack_58[1] = '\0';
  acStack_58[2] = '\0';
  acStack_58[3] = '\0';
  acStack_58[4] = '\0';
  acStack_58[5] = '\0';
  acStack_58[6] = '\0';
  acStack_58[7] = '\0';
  str_t[0] = '\0';
  str_t[1] = '\0';
  str_t[2] = '\0';
  str_t[3] = '\0';
  str_t[4] = '\0';
  str_t[5] = '\0';
  str_t[6] = '\0';
  str_t[7] = '\0';
  gettimeofday((timeval *)(str_t + 0x18),(__timezone_ptr_t)0x0);
  tv.tv_usec = stack0xffffffffffffffc8;
  __tp = localtime(&tv.tv_usec);
  strftime(acStack_58,0x1a,"%Y-%m-%d %H:%M:%S\n",__tp);
  LogStream::operator<<(&this->stream_,acStack_58);
  LogStream::operator<<(&this->stream_,"+-----------------------+\n");
  return;
}

Assistant:

void Logger::Impl::formatTime()
{
    struct timeval tv;
    time_t time;
    char str_t[26] = {0};
    gettimeofday (&tv, NULL);
    time = tv.tv_sec;
    struct tm* p_time = localtime(&time);   
    strftime(str_t, 26, "%Y-%m-%d %H:%M:%S\n", p_time);
    stream_ << str_t;
    stream_ << "+-----------------------+\n";

}